

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_things.cpp
# Opt level: O1

void swrenderer::R_DrawSprite(vissprite_t *spr)

{
  float fVar1;
  byte bVar2;
  BYTE BVar3;
  byte bVar4;
  short sVar5;
  short sVar6;
  anon_struct_4_4_d8359877_for_anon_union_4_2_12391d7c_for_PalEntry_0_0 color;
  lighttable_t *plVar7;
  sector_t_conflict *psVar8;
  extsector_t *peVar9;
  lightlist_t *plVar10;
  F3DFloor *pFVar11;
  secplane_t *psVar12;
  vertex_t *pvVar13;
  vertex_t *pvVar14;
  double dVar15;
  double dVar16;
  undefined2 uVar17;
  PalEntry fade;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  BYTE *pBVar21;
  long lVar22;
  int iVar23;
  int iVar24;
  FDynamicColormap **ppFVar25;
  short sVar26;
  short sVar27;
  int x2;
  short sVar28;
  short sVar29;
  uint uVar30;
  anon_union_4_2_12391d7c_for_PalEntry_0 fade_00;
  sector_t *psVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  ulong uVar35;
  FDynamicColormap *unaff_R14;
  drawseg_t *ds;
  drawseg_t *pdVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  float in_XMM7_Da;
  float in_XMM8_Da;
  
  plVar7 = (spr->Style).colormap;
  if (((spr->field_0x90 & 1) == 0) && ((spr->field_13).pic == (FTexture *)0x0)) {
    if (((fake3D & 1) != 0) && ((double)(spr->gpos).Z <= sclipBottom)) {
      return;
    }
    if (((fake3D & 2) != 0) && (sclipTop <= (double)(spr->gpos).Z)) {
      return;
    }
    R_DrawParticle(spr);
    return;
  }
  sVar5 = spr->x1;
  uVar35 = (ulong)sVar5;
  sVar6 = spr->x2;
  lVar34 = (long)sVar6;
  if (sVar6 <= sVar5) {
    return;
  }
  psVar8 = spr->sector;
  if (psVar8 == (sector_t_conflict *)0x0) {
    return;
  }
  if (((fake3D & 1) != 0) && ((double)(spr->field_3).field_0.gzt <= sclipBottom)) {
    return;
  }
  if (((fake3D & 2) != 0) && (sclipTop <= (double)(spr->field_3).field_0.gzb)) {
    return;
  }
  if ((((fixedcolormap == 0) && (fixedlightlev < 0)) &&
      (peVar9 = psVar8->e, peVar9 != (extsector_t *)0x0)) &&
     (uVar19 = (peVar9->XFloor).lightlist.Count, uVar19 != 0)) {
    if ((fake3D & 2) == 0) {
      sclipTop = ((psVar8->ceilingplane).normal.Y * ViewPos.Y +
                 (psVar8->ceilingplane).normal.X * ViewPos.X + (psVar8->ceilingplane).D) *
                 (psVar8->ceilingplane).negiC;
    }
    psVar31 = (sector_t *)0x0;
    do {
      uVar19 = uVar19 - 1;
      if ((int)uVar19 < 0) goto LAB_002ee85b;
      uVar30 = uVar19 & 0x7fffffff;
      plVar10 = (peVar9->XFloor).lightlist.Array;
    } while (plVar10[uVar30].plane.D * plVar10[uVar30].plane.negiC < sclipTop);
    pFVar11 = plVar10[uVar30].caster;
    if ((pFVar11 == (F3DFloor *)0x0) ||
       (((pFVar11->flags >> 0x10 & 1) != 0 &&
        (psVar12 = (pFVar11->bottom).plane, sclipTop <= psVar12->D * psVar12->negiC)))) {
      psVar31 = (sector_t *)0x0;
    }
    else {
      psVar31 = pFVar11->model;
      ppFVar25 = &psVar31->ColorMap;
      if ((pFVar11->flags >> 0x1b & 1) == 0) {
        ppFVar25 = &plVar10[uVar30].extra_colormap;
      }
      unaff_R14 = *ppFVar25;
    }
LAB_002ee85b:
    if (psVar31 != (sector_t *)0x0) {
      bVar2 = (spr->Style).RenderStyle.field_0.Flags;
      uVar30 = bVar2 & 0x20;
      uVar19 = uVar30 >> 5 ^ 1;
      if ((bVar2 & 0x10) == 0) {
        uVar19 = uVar30;
      }
      if (((spr->Style).RenderStyle.AsDWORD == LegacyRenderStyles[7].AsDWORD) &&
         ((unaff_R14->Fade).field_0.d != 0)) {
        unaff_R14 = GetSpecialLights((PalEntry)(unaff_R14->Color).field_0.field_0,(PalEntry)0x0,
                                     unaff_R14->Desaturate);
      }
      if (((spr->Style).RenderStyle.field_0.Flags & 0x40) != 0) {
        fade_00.d = 0xffffff;
        if (uVar19 == 0) {
          fade_00.d = 0;
        }
        unaff_R14 = GetSpecialLights((PalEntry)(unaff_R14->Color).field_0.field_0,(PalEntry)fade_00,
                                     unaff_R14->Desaturate);
        uVar19 = 0;
      }
      if (uVar19 != 0) {
        color = (unaff_R14->Color).field_0.field_0;
        fade = PalEntry::InverseColor(&unaff_R14->Fade);
        unaff_R14 = GetSpecialLights((PalEntry)color,fade,unaff_R14->Desaturate);
      }
      uVar20 = (ulong)fixedlightlev;
      if ((long)uVar20 < 0) {
        if ((foggy != '\0') || ((spr->renderflags & 0x10) == 0)) {
          spriteshade = (psVar31->lightlevel + r_actualextralight) * -0x4000 + 0x3d0000;
          dVar38 = (double)spr->depth;
          if (dVar38 <= 0.0078125) {
            dVar38 = 0.0078125;
          }
          dVar38 = r_SpriteVisibility / dVar38;
          if (24.0 <= dVar38) {
            dVar38 = 24.0;
          }
          iVar23 = spriteshade - SUB84(dVar38 + 103079215104.0,0) >> 0x10;
          iVar18 = 0x1f;
          if (iVar23 < 0x1f) {
            iVar18 = iVar23;
          }
          iVar23 = 0;
          if (0 < iVar18) {
            iVar23 = iVar18;
          }
          uVar20 = (ulong)(uint)(iVar23 << 8);
          goto LAB_002ee997;
        }
        if (r_fullbrightignoresectorcolor.Value != false) {
          unaff_R14 = &FullNormalLight;
        }
        pBVar21 = unaff_R14->Maps;
      }
      else {
LAB_002ee997:
        pBVar21 = unaff_R14->Maps + uVar20;
      }
      (spr->Style).colormap = pBVar21;
    }
  }
  bVar2 = spr->field_0x90;
  dVar38 = 2.2250738585072014e-308;
  if (((bVar2 & 1) != 0) && (spr->floorclip != 0.0)) {
    dVar38 = (double)(spr->field_3).field_0.gzb;
  }
  dVar15 = (double)spr->idepth * InvZtoScale;
  psVar8 = spr->heightsec;
  sVar28 = (short)viewheight;
  if ((psVar8 == (sector_t_conflict *)0x0) || ((psVar8->MoreFlags & 0x10) != 0)) {
    dVar39 = 1.79769313486232e+308;
    if (((bVar2 & 1) == 0) && (spr->floorclip != 0.0)) {
      dVar37 = CenterY + 6755399441055744.0 +
               (double)spr->yscale *
               ((double)((spr->field_13).pic)->Height -
               (spr->floorclip + (spr->field_14).field_0.texturemid));
      sVar26 = 0;
      if (SUB84(dVar37,0) < (int)sVar28) {
        sVar28 = SUB82(dVar37,0);
        if (sVar28 < 1) {
          sVar28 = 0;
        }
        goto LAB_002eec04;
      }
    }
    sVar26 = 0;
  }
  else {
    BVar3 = spr->FakeFlatStat;
    if (BVar3 == '\x02') {
      dVar39 = 1.79769313486232e+308;
      sVar26 = 0;
    }
    else {
      dVar39 = ((double)(spr->gpos).Y * (psVar8->floorplane).normal.Y +
               (double)(spr->gpos).X * (psVar8->floorplane).normal.X + (psVar8->floorplane).D) *
               (psVar8->floorplane).negiC;
      dVar37 = CenterY + 6755399441055744.0 + (ViewPos.Z - dVar39) * dVar15;
      sVar26 = SUB82(dVar37,0);
      iVar18 = SUB84(dVar37,0);
      if (BVar3 == '\x01') {
        iVar23 = viewheight;
        if (iVar18 < viewheight) {
          iVar23 = iVar18;
        }
        sVar26 = (short)iVar23;
        if (iVar18 < 1) {
          sVar26 = 0;
        }
        if ((bVar2 & 1) != 0) {
          sVar26 = 0;
        }
      }
      else {
        if ((((bVar2 & 1) == 0) && (iVar18 < sVar28)) && (sVar28 = 0, 0 < sVar26)) {
          sVar28 = sVar26;
        }
        if (dVar38 <= dVar39) {
          dVar38 = dVar39;
        }
        dVar39 = 1.79769313486232e+308;
        sVar26 = 0;
      }
    }
    if ((char)((psVar8->MoreFlags & 2) >> 1) == '\0' && BVar3 != '\x01') {
      dVar37 = ((double)(spr->gpos).Y * (psVar8->ceilingplane).normal.Y +
               (double)(spr->gpos).X * (psVar8->ceilingplane).normal.X + (psVar8->ceilingplane).D) *
               (psVar8->ceilingplane).negiC;
      dVar16 = CenterY + 6755399441055744.0 + (ViewPos.Z - dVar37) * dVar15;
      sVar27 = SUB82(dVar16,0);
      iVar18 = SUB84(dVar16,0);
      if (BVar3 == '\x02') {
        sVar29 = 0;
        if (0 < sVar27) {
          sVar29 = sVar27;
        }
        if (sVar28 <= iVar18) {
          sVar29 = sVar28;
        }
        if ((bVar2 & 1) != 0) {
          sVar29 = sVar28;
        }
        sVar28 = sVar29;
        if (dVar38 <= dVar37) {
          dVar38 = dVar37;
        }
      }
      else {
        iVar23 = viewheight;
        if (iVar18 < viewheight) {
          iVar23 = iVar18;
        }
        sVar27 = (short)iVar23;
        if (iVar18 <= sVar26) {
          sVar27 = sVar26;
        }
        if ((bVar2 & 1) != 0) {
          sVar27 = sVar26;
        }
        sVar26 = sVar27;
        if (dVar37 <= dVar39) {
          dVar39 = dVar37;
        }
      }
    }
  }
LAB_002eec04:
  if ((fake3D & 1) != 0) {
    if ((bVar2 & 1) == 0) {
      pFVar11 = spr->fakefloor;
      dVar37 = sclipBottom;
      if (((pFVar11 != (F3DFloor *)0x0) &&
          (psVar12 = (pFVar11->top).plane, dVar16 = psVar12->D * psVar12->negiC, dVar16 < ViewPos.Z)
          ) && (dVar16 == sclipBottom)) {
        psVar12 = (pFVar11->bottom).plane;
        dVar37 = psVar12->D * psVar12->negiC;
      }
      dVar37 = CenterY + 6755399441055744.0 + (ViewPos.Z - dVar37) * dVar15;
      sVar27 = SUB82(dVar37,0);
      if ((SUB84(dVar37,0) < (int)sVar28) && (sVar28 = 0, 0 < sVar27)) {
        sVar28 = sVar27;
      }
    }
    if (dVar38 <= sclipBottom) {
      dVar38 = sclipBottom;
    }
  }
  if ((fake3D & 2) != 0) {
    if ((bVar2 & 1) == 0) {
      pFVar11 = spr->fakeceiling;
      dVar37 = sclipTop;
      if (((pFVar11 != (F3DFloor *)0x0) &&
          (psVar12 = (pFVar11->bottom).plane, dVar16 = psVar12->D * psVar12->negiC,
          ViewPos.Z < dVar16)) && (dVar16 == sclipTop)) {
        psVar12 = (pFVar11->top).plane;
        dVar37 = psVar12->D * psVar12->negiC;
      }
      iVar18 = SUB84(CenterY + 6755399441055744.0 + (ViewPos.Z - dVar37) * dVar15,0);
      if (sVar26 < iVar18) {
        iVar23 = viewheight;
        if (iVar18 < viewheight) {
          iVar23 = iVar18;
        }
        sVar26 = (short)iVar23;
      }
    }
    if (sclipTop <= dVar39) {
      dVar39 = sclipTop;
    }
  }
  if (sVar26 < sVar28) {
    iVar18 = (int)sVar6;
    iVar23 = (int)sVar5;
    lVar32 = 0;
    do {
      R_DrawSprite::clipbot[uVar35 + lVar32] = sVar28;
      R_DrawSprite::cliptop[uVar35 + lVar32] = sVar26;
      lVar32 = lVar32 + 1;
    } while (iVar18 - iVar23 != (int)lVar32);
    pdVar36 = ds_p;
    if (firstdrawseg < ds_p) {
LAB_002eedbe:
      do {
        ds = pdVar36 + -1;
        if (pdVar36[-1].fake == 0) {
          sVar28 = pdVar36[-1].x1;
          if (((sVar28 < sVar6) && (sVar26 = pdVar36[-1].x2, sVar5 < sVar26)) &&
             ((bVar2 = pdVar36[-1].silhouette, (bVar2 & 3) != 0 ||
              ((pdVar36[-1].maskedtexturecol != -1 || (pdVar36[-1].bFogBoundary != '\0')))))) {
            iVar24 = iVar23;
            if (sVar5 < sVar28) {
              iVar24 = (int)sVar28;
            }
            sVar27 = sVar6;
            if (sVar26 < sVar6) {
              sVar27 = sVar26;
            }
            bVar4 = spr->field_0x90;
            if ((bVar4 & 2) == 0) {
              in_XMM8_Da = pdVar36[-1].sz1;
              fVar1 = pdVar36[-1].sz2;
              in_XMM7_Da = fVar1;
              if (fVar1 <= in_XMM8_Da) {
                in_XMM7_Da = in_XMM8_Da;
                in_XMM8_Da = fVar1;
              }
            }
            x2 = (int)sVar27;
            if ((bVar4 & 2) == 0) {
              if (spr->depth <= in_XMM8_Da && in_XMM8_Da != spr->depth) goto LAB_002eef58;
              if (((bVar4 & 2) != 0) || (spr->depth <= in_XMM7_Da && in_XMM7_Da != spr->depth))
              goto LAB_002eee5f;
LAB_002eeeaf:
              lVar32 = (long)iVar24;
              if ((bVar2 & 1) != 0) {
                lVar22 = pdVar36[-1].sprbottomclip * 2 + openings;
                lVar33 = 0;
                do {
                  sVar26 = *(short *)(lVar22 + lVar32 * 2 + (long)sVar28 * -2 + lVar33 * 2);
                  if (sVar26 < R_DrawSprite::clipbot[lVar32 + lVar33]) {
                    R_DrawSprite::clipbot[lVar32 + lVar33] = sVar26;
                  }
                  lVar33 = lVar33 + 1;
                } while (x2 - iVar24 != (int)lVar33);
              }
              if ((bVar2 & 2) != 0) {
                lVar22 = pdVar36[-1].sprtopclip * 2 + openings;
                sVar28 = pdVar36[-1].x1;
                lVar33 = 0;
                do {
                  sVar26 = *(short *)(lVar22 + lVar32 * 2 + (long)sVar28 * -2 + lVar33 * 2);
                  if (R_DrawSprite::cliptop[lVar32 + lVar33] < sVar26) {
                    R_DrawSprite::cliptop[lVar32 + lVar33] = sVar26;
                  }
                  lVar33 = lVar33 + 1;
                } while (x2 - iVar24 != (int)lVar33);
              }
            }
            else {
LAB_002eee5f:
              pvVar13 = ds->curline->v1;
              pvVar14 = ds->curline->v2;
              dVar15 = (pvVar13->p).X;
              dVar37 = (pvVar13->p).Y;
              if (((pvVar14->p).Y - dVar37) * ((double)(spr->gpos).X - dVar15) <
                  ((pvVar14->p).X - dVar15) * ((double)(spr->gpos).Y - dVar37)) goto LAB_002eeeaf;
LAB_002eef58:
              if ((pdVar36[-1].CurrentPortalUniq == CurrentPortalUniq) &&
                 ((pdVar36[-1].maskedtexturecol != -1 || (pdVar36[-1].bFogBoundary != '\0')))) {
                R_RenderMaskedSegRange(ds,iVar24,x2);
              }
            }
            pdVar36 = ds;
            if (ds <= firstdrawseg) break;
            goto LAB_002eedbe;
          }
        }
        pdVar36 = ds;
      } while (firstdrawseg < ds);
    }
    if ((spr->field_0x90 & 1) == 0) {
      mfloorclip = R_DrawSprite::clipbot;
      mceilingclip = R_DrawSprite::cliptop;
      if ((spr->field_0x90 & 2) == 0) {
        R_DrawVisSprite(spr);
      }
      else {
        R_DrawWallSprite(spr);
      }
    }
    else {
      if (R_DrawSprite::clipbot[lVar34] <= R_DrawSprite::cliptop[lVar34]) {
        iVar24 = iVar23;
        if (sVar5 < sVar6) {
          lVar32 = uVar35 * 2;
          lVar22 = 0;
          do {
            if (*(short *)((long)R_DrawSprite::cliptop + lVar32) <
                *(short *)((long)R_DrawSprite::clipbot + lVar32)) {
              iVar24 = iVar23 - (int)lVar22;
              break;
            }
            lVar22 = lVar22 + -1;
            lVar32 = lVar32 + 2;
            iVar24 = iVar18;
          } while (uVar35 - lVar34 != lVar22);
        }
        if (iVar24 == iVar18) goto LAB_002ef11d;
      }
      if (0 < sVar5) {
        uVar17 = (short)viewheight;
        lVar32 = 0;
        do {
          *(undefined2 *)((long)R_DrawSprite::cliptop + lVar32) = uVar17;
          lVar32 = lVar32 + 2;
        } while ((uVar35 & 0xffffffff) * 2 != lVar32);
      }
      if (((int)sVar6 < viewwidth + -1) && (uVar19 = viewwidth - iVar18, uVar19 != 0)) {
        sVar5 = (short)viewheight;
        uVar35 = 0;
        do {
          R_DrawSprite::cliptop[lVar34 + uVar35] = sVar5;
          uVar35 = uVar35 + 1;
        } while (uVar19 != uVar35);
      }
      dVar15 = (double)(spr->field_3).field_0.gzt;
      iVar18 = 0;
      if (dVar39 < dVar15) {
        iVar18 = SUB84((dVar15 - dVar39) / (double)spr->yscale + 6755399441055744.0,0);
      }
      iVar23 = 0x7fffffff;
      if ((double)(spr->field_3).field_0.gzb <= dVar38) {
        iVar23 = SUB84((dVar15 - dVar38) / (double)spr->yscale + 6755399441055744.0,0);
      }
      R_DrawVisVoxel(spr,iVar18,iVar23,R_DrawSprite::cliptop,R_DrawSprite::clipbot);
    }
  }
LAB_002ef11d:
  (spr->Style).colormap = plVar7;
  return;
}

Assistant:

void R_DrawSprite (vissprite_t *spr)
{
	static short clipbot[MAXWIDTH];
	static short cliptop[MAXWIDTH];
	drawseg_t *ds;
	int i;
	int x1, x2;
	int r1, r2;
	short topclip, botclip;
	short *clip1, *clip2;
	lighttable_t *colormap = spr->Style.colormap;
	F3DFloor *rover;
	FDynamicColormap *mybasecolormap;

	// [RH] Check for particles
	if (!spr->bIsVoxel && spr->pic == NULL)
	{
		// kg3D - reject invisible parts
		if ((fake3D & FAKE3D_CLIPBOTTOM) && spr->gpos.Z <= sclipBottom) return;
		if ((fake3D & FAKE3D_CLIPTOP)    && spr->gpos.Z >= sclipTop) return;
		R_DrawParticle (spr);
		return;
	}

	x1 = spr->x1;
	x2 = spr->x2;

	// [RH] Quickly reject sprites with bad x ranges.
	if (x1 >= x2)
		return;

	// [RH] Sprites split behind a one-sided line can also be discarded.
	if (spr->sector == NULL)
		return;

	// kg3D - reject invisible parts
	if ((fake3D & FAKE3D_CLIPBOTTOM) && spr->gzt <= sclipBottom) return;
	if ((fake3D & FAKE3D_CLIPTOP)    && spr->gzb >= sclipTop) return;

	// kg3D - correct colors now
	if (!fixedcolormap && fixedlightlev < 0 && spr->sector->e && spr->sector->e->XFloor.lightlist.Size()) 
	{
		if (!(fake3D & FAKE3D_CLIPTOP))
		{
			sclipTop = spr->sector->ceilingplane.ZatPoint(ViewPos);
		}
		sector_t *sec = NULL;
		for (i = spr->sector->e->XFloor.lightlist.Size() - 1; i >= 0; i--)
		{
			if (sclipTop <= spr->sector->e->XFloor.lightlist[i].plane.Zat0()) 
			{
				rover = spr->sector->e->XFloor.lightlist[i].caster;
				if (rover) 
				{
					if (rover->flags & FF_DOUBLESHADOW && sclipTop <= rover->bottom.plane->Zat0())
					{
						break;
					}
					sec = rover->model;
					if (rover->flags & FF_FADEWALLS)
					{
						mybasecolormap = sec->ColorMap;
					}
					else
					{
						mybasecolormap = spr->sector->e->XFloor.lightlist[i].extra_colormap;
					}
				}
				break;
			}
		}
		// found new values, recalculate
		if (sec) 
		{
			INTBOOL invertcolormap = (spr->Style.RenderStyle.Flags & STYLEF_InvertOverlay);

			if (spr->Style.RenderStyle.Flags & STYLEF_InvertSource)
			{
				invertcolormap = !invertcolormap;
			}

			// Sprites that are added to the scene must fade to black.
			if (spr->Style.RenderStyle == LegacyRenderStyles[STYLE_Add] && mybasecolormap->Fade != 0)
			{
				mybasecolormap = GetSpecialLights(mybasecolormap->Color, 0, mybasecolormap->Desaturate);
			}

			if (spr->Style.RenderStyle.Flags & STYLEF_FadeToBlack)
			{
				if (invertcolormap)
				{ // Fade to white
					mybasecolormap = GetSpecialLights(mybasecolormap->Color, MAKERGB(255,255,255), mybasecolormap->Desaturate);
					invertcolormap = false;
				}
				else
				{ // Fade to black
					mybasecolormap = GetSpecialLights(mybasecolormap->Color, MAKERGB(0,0,0), mybasecolormap->Desaturate);
				}
			}

			// get light level
			if (invertcolormap)
			{
				mybasecolormap = GetSpecialLights(mybasecolormap->Color, mybasecolormap->Fade.InverseColor(), mybasecolormap->Desaturate);
			}
			if (fixedlightlev >= 0)
			{
				spr->Style.colormap = mybasecolormap->Maps + fixedlightlev;
			}
			else if (!foggy && (spr->renderflags & RF_FULLBRIGHT))
			{ // full bright
				spr->Style.colormap = (r_fullbrightignoresectorcolor) ? FullNormalLight.Maps : mybasecolormap->Maps;
			}
			else
			{ // diminished light
				spriteshade = LIGHT2SHADE(sec->lightlevel + r_actualextralight);
				spr->Style.colormap = mybasecolormap->Maps + (GETPALOOKUP(
					r_SpriteVisibility / MAX(MINZ, (double)spr->depth), spriteshade) << COLORMAPSHIFT);
			}
		}
	}

	// [RH] Initialize the clipping arrays to their largest possible range
	// instead of using a special "not clipped" value. This eliminates
	// visual anomalies when looking down and should be faster, too.
	topclip = 0;
	botclip = viewheight;

	// killough 3/27/98:
	// Clip the sprite against deep water and/or fake ceilings.
	// [RH] rewrote this to be based on which part of the sector is really visible

	double scale = InvZtoScale * spr->idepth;
	double hzb = DBL_MIN, hzt = DBL_MAX;

	if (spr->bIsVoxel && spr->floorclip != 0)
	{
		hzb = spr->gzb;
	}

	if (spr->heightsec && !(spr->heightsec->MoreFlags & SECF_IGNOREHEIGHTSEC))
	{ // only things in specially marked sectors
		if (spr->FakeFlatStat != FAKED_AboveCeiling)
		{
			double hz = spr->heightsec->floorplane.ZatPoint(spr->gpos);
			int h = xs_RoundToInt(CenterY - (hz - ViewPos.Z) * scale);

			if (spr->FakeFlatStat == FAKED_BelowFloor)
			{ // seen below floor: clip top
				if (!spr->bIsVoxel && h > topclip)
				{
					topclip = short(MIN(h, viewheight));
				}
				hzt = MIN(hzt, hz);
			}
			else
			{ // seen in the middle: clip bottom
				if (!spr->bIsVoxel && h < botclip)
				{
					botclip = MAX<short> (0, h);
				}
				hzb = MAX(hzb, hz);
			}
		}
		if (spr->FakeFlatStat != FAKED_BelowFloor && !(spr->heightsec->MoreFlags & SECF_FAKEFLOORONLY))
		{
			double hz = spr->heightsec->ceilingplane.ZatPoint(spr->gpos);
			int h = xs_RoundToInt(CenterY - (hz - ViewPos.Z) * scale);

			if (spr->FakeFlatStat == FAKED_AboveCeiling)
			{ // seen above ceiling: clip bottom
				if (!spr->bIsVoxel && h < botclip)
				{
					botclip = MAX<short> (0, h);
				}
				hzb = MAX(hzb, hz);
			}
			else
			{ // seen in the middle: clip top
				if (!spr->bIsVoxel && h > topclip)
				{
					topclip = MIN(h, viewheight);
				}
				hzt = MIN(hzt, hz);
			}
		}
	}
	// killough 3/27/98: end special clipping for deep water / fake ceilings
	else if (!spr->bIsVoxel && spr->floorclip)
	{ // [RH] Move floorclip stuff from R_DrawVisSprite to here
		//int clip = ((FLOAT2FIXED(CenterY) - FixedMul (spr->texturemid - (spr->pic->GetHeight() << FRACBITS) + spr->floorclip, spr->yscale)) >> FRACBITS);
		int clip = xs_RoundToInt(CenterY - (spr->texturemid - spr->pic->GetHeight() + spr->floorclip) * spr->yscale);
		if (clip < botclip)
		{
			botclip = MAX<short>(0, clip);
		}
	}

	if (fake3D & FAKE3D_CLIPBOTTOM)
	{
		if (!spr->bIsVoxel)
		{
			double hz = sclipBottom;
			if (spr->fakefloor)
			{
				double floorz = spr->fakefloor->top.plane->Zat0();
				if (ViewPos.Z > floorz && floorz == sclipBottom )
				{
					hz = spr->fakefloor->bottom.plane->Zat0();
				}
			}
			int h = xs_RoundToInt(CenterY - (hz - ViewPos.Z) * scale);
			if (h < botclip)
			{
				botclip = MAX<short>(0, h);
			}
		}
		hzb = MAX(hzb, sclipBottom);
	}
	if (fake3D & FAKE3D_CLIPTOP)
	{
		if (!spr->bIsVoxel)
		{
			double hz = sclipTop;
			if (spr->fakeceiling != NULL)
			{
				double ceilingZ = spr->fakeceiling->bottom.plane->Zat0();
				if (ViewPos.Z < ceilingZ && ceilingZ == sclipTop)
				{
					hz = spr->fakeceiling->top.plane->Zat0();
				}
			}
			int h = xs_RoundToInt(CenterY - (hz - ViewPos.Z) * scale);
			if (h > topclip)
			{
				topclip = short(MIN(h, viewheight));
			}
		}
		hzt = MIN(hzt, sclipTop);
	}

#if 0
	// [RH] Sprites that were split by a drawseg should also be clipped
	// by the sector's floor and ceiling. (Not sure how/if to handle this
	// with fake floors, since those already do clipping.)
	if (spr->bSplitSprite &&
		(spr->heightsec == NULL || (spr->heightsec->MoreFlags & SECF_IGNOREHEIGHTSEC)))
	{
		fixed_t h = spr->sector->floorplane.ZatPoint (spr->gx, spr->gy);
		h = (centeryfrac - FixedMul (h-viewz, scale)) >> FRACBITS;
		if (h < botclip)
		{
			botclip = MAX<short> (0, h);
		}
		h = spr->sector->ceilingplane.ZatPoint (spr->gx, spr->gy);
		h = (centeryfrac - FixedMul (h-viewz, scale)) >> FRACBITS;
		if (h > topclip)
		{
			topclip = short(MIN(h, viewheight));
		}
	}
#endif

	if (topclip >= botclip)
	{
		spr->Style.colormap = colormap;
		return;
	}

	i = x2 - x1;
	clip1 = clipbot + x1;
	clip2 = cliptop + x1;
	do
	{
		*clip1++ = botclip;
		*clip2++ = topclip;
	} while (--i);

	// Scan drawsegs from end to start for obscuring segs.
	// The first drawseg that is closer than the sprite is the clip seg.

	// Modified by Lee Killough:
	// (pointer check was originally nonportable
	// and buggy, by going past LEFT end of array):

	//		for (ds=ds_p-1 ; ds >= drawsegs ; ds--)    old buggy code

	for (ds = ds_p; ds-- > firstdrawseg; )  // new -- killough
	{
		// [ZZ] portal handling here
		//if (ds->CurrentPortalUniq != spr->CurrentPortalUniq)
		//	continue;
		// [ZZ] WARNING: uncommenting the two above lines, totally breaks sprite clipping

		// kg3D - no clipping on fake segs
		if (ds->fake) continue;
		// determine if the drawseg obscures the sprite
		if (ds->x1 >= x2 || ds->x2 <= x1 ||
			(!(ds->silhouette & SIL_BOTH) && ds->maskedtexturecol == -1 &&
			 !ds->bFogBoundary) )
		{
			// does not cover sprite
			continue;
		}

		r1 = MAX<int> (ds->x1, x1);
		r2 = MIN<int> (ds->x2, x2);

		float neardepth, fardepth;
		if (!spr->bWallSprite)
		{
			if (ds->sz1 < ds->sz2)
			{
				neardepth = ds->sz1, fardepth = ds->sz2;
			}
			else
			{
				neardepth = ds->sz2, fardepth = ds->sz1;
			}
		}
		// Check if sprite is in front of draw seg:
		if ((!spr->bWallSprite && neardepth > spr->depth) || ((spr->bWallSprite || fardepth > spr->depth) &&
			(spr->gpos.Y - ds->curline->v1->fY()) * (ds->curline->v2->fX() - ds->curline->v1->fX()) -
			(spr->gpos.X - ds->curline->v1->fX()) * (ds->curline->v2->fY() - ds->curline->v1->fY()) <= 0))
		{
			// seg is behind sprite, so draw the mid texture if it has one
			if (ds->CurrentPortalUniq == CurrentPortalUniq && // [ZZ] instead, portal uniq check is made here
				(ds->maskedtexturecol != -1 || ds->bFogBoundary))
				R_RenderMaskedSegRange (ds, r1, r2);
			continue;
		}

		// clip this piece of the sprite
		// killough 3/27/98: optimized and made much shorter
		// [RH] Optimized further (at least for VC++;
		// other compilers should be at least as good as before)

		if (ds->silhouette & SIL_BOTTOM) //bottom sil
		{
			clip1 = clipbot + r1;
			clip2 = openings + ds->sprbottomclip + r1 - ds->x1;
			i = r2 - r1;
			do
			{
				if (*clip1 > *clip2)
					*clip1 = *clip2;
				clip1++;
				clip2++;
			} while (--i);
		}

		if (ds->silhouette & SIL_TOP)   // top sil
		{
			clip1 = cliptop + r1;
			clip2 = openings + ds->sprtopclip + r1 - ds->x1;
			i = r2 - r1;
			do
			{
				if (*clip1 < *clip2)
					*clip1 = *clip2;
				clip1++;
				clip2++;
			} while (--i);
		}
	}

	// all clipping has been performed, so draw the sprite

	if (!spr->bIsVoxel)
	{
		mfloorclip = clipbot;
		mceilingclip = cliptop;
		if (!spr->bWallSprite)
		{
			R_DrawVisSprite(spr);
		}
		else
		{
			R_DrawWallSprite(spr);
		}
	}
	else
	{
		// If it is completely clipped away, don't bother drawing it.
		if (cliptop[x2] >= clipbot[x2])
		{
			for (i = x1; i < x2; ++i)
			{
				if (cliptop[i] < clipbot[i])
				{
					break;
				}
			}
			if (i == x2)
			{
				spr->Style.colormap = colormap;
				return;
			}
		}
		// Add everything outside the left and right edges to the clipping array
		// for R_DrawVisVoxel().
		if (x1 > 0)
		{
			fillshort(cliptop, x1, viewheight);
		}
		if (x2 < viewwidth - 1)
		{
			fillshort(cliptop + x2, viewwidth - x2, viewheight);
		}
		int minvoxely = spr->gzt <= hzt ? 0 : xs_RoundToInt((spr->gzt - hzt) / spr->yscale);
		int maxvoxely = spr->gzb > hzb ? INT_MAX : xs_RoundToInt((spr->gzt - hzb) / spr->yscale);
		R_DrawVisVoxel(spr, minvoxely, maxvoxely, cliptop, clipbot);
	}
	spr->Style.colormap = colormap;
}